

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmObjFixup::CVmObjFixup(CVmObjFixup *this,ulong entry_cnt)

{
  obj_fixup_entry **ppoVar1;
  obj_fixup_entry *poVar2;
  size_t __size;
  uint uVar3;
  ulong uVar4;
  
  this->cnt_ = entry_cnt;
  this->used_ = 0;
  if (entry_cnt == 0) {
    this->arr_ = (obj_fixup_entry **)0x0;
    this->pages_ = 0;
  }
  else {
    uVar4 = entry_cnt + 0x7ff >> 0xb;
    this->pages_ = uVar4;
    ppoVar1 = (obj_fixup_entry **)malloc(uVar4 * 8);
    this->arr_ = ppoVar1;
    for (uVar3 = 1; uVar3 - 1 < uVar4; uVar3 = uVar3 + 1) {
      __size = (ulong)((int)entry_cnt * 8 + 0x3ff8U & 0x3ff8) + 8;
      if (uVar4 != uVar3) {
        __size = 0x4000;
      }
      poVar2 = (obj_fixup_entry *)malloc(__size);
      this->arr_[uVar3 - 1] = poVar2;
      uVar4 = this->pages_;
    }
  }
  return;
}

Assistant:

CVmObjFixup::CVmObjFixup(ulong entry_cnt)
{
    uint i;

    /* remember the number of entries */
    cnt_ = entry_cnt;
    
    /* no entries are used yet */
    used_ = 0;
    
    /* if we have no entries, there's nothing to do */
    if (cnt_ == 0)
    {
        arr_ = 0;
        pages_ = 0;
        return;
    }

    /* calculate the number of subarrays we need */
    pages_ = (entry_cnt + VMOBJFIXUP_SUB_SIZE - 1) / VMOBJFIXUP_SUB_SIZE;
    
    /* allocate the necessary number of subarrays */
    arr_ = (obj_fixup_entry **)t3malloc(pages_ * sizeof(arr_[0]));
    
    /* allocate the subarrays */
    for (i = 0 ; i < pages_ ; ++i)
    {
        size_t cur_cnt;
        
        /* 
         *   allocate a full page, except for the last page, which might be
         *   only partially used 
         */
        cur_cnt = VMOBJFIXUP_SUB_SIZE;
        if (i + 1 == pages_)
            cur_cnt = ((entry_cnt - 1) % VMOBJFIXUP_SUB_SIZE) + 1;
        
        /* allocate it */
        arr_[i] = (obj_fixup_entry *)t3malloc(cur_cnt * sizeof(arr_[i][i]));
    }
}